

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O2

bool __thiscall
S2ContainsPointQuery<MutableS2ShapeIndex>::VisitContainingShapes
          (S2ContainsPointQuery<MutableS2ShapeIndex> *this,S2Point *p,ShapeVisitor_conflict *visitor
          )

{
  uint uVar1;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  bool bVar2;
  const_reference clipped;
  int s;
  size_type_conflict n;
  bool bVar3;
  
  bVar2 = MutableS2ShapeIndex::Iterator::Locate(&this->it_,p);
  bVar3 = true;
  if (bVar2) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              (this->it_).super_IteratorBase.cell_._M_b._M_p;
    uVar1 = *(uint *)&this_00->field_0x0;
    for (n = 0; bVar3 = (uVar1 & 0xffffff) == n, !bVar3; n = n + 1) {
      clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                          (this_00,n);
      bVar2 = ShapeContains(this,&this->it_,clipped,p);
      if ((bVar2) &&
         (bVar2 = std::function<bool_(S2Shape_*)>::operator()
                            (visitor,(S2Shape *)
                                     (this->index_->shapes_).
                                     super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[clipped->shape_id_].
                                     _M_t.
                                     super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>),
         !bVar2)) {
        return bVar3;
      }
    }
  }
  return bVar3;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::VisitContainingShapes(
    const S2Point& p, const ShapeVisitor& visitor) {
  // This function returns "false" only if the algorithm terminates early
  // because the "visitor" function returned false.
  if (!it_.Locate(p)) return true;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    if (ShapeContains(it_, clipped, p) &&
        !visitor(index_->shape(clipped.shape_id()))) {
      return false;
    }
  }
  return true;
}